

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemoryRegionSection *
address_space_translate_iommu
          (MemoryRegionSection *__return_storage_ptr__,IOMMUMemoryRegion *iommu_mr,hwaddr *xlat,
          hwaddr *plen_out,hwaddr *page_mask_out,_Bool is_write,_Bool is_mmio,
          AddressSpace **target_as,MemTxAttrs attrs)

{
  IOMMUMemoryRegionClass *pIVar1;
  ulong uVar2;
  AddressSpaceDispatch *d;
  MemoryRegionSection *__src;
  IOMMUAccessFlags IVar3;
  MemTxAttrs MVar4;
  hwaddr in_stack_ffffffffffffff18;
  IOMMUTLBEntry local_b8;
  AddressSpace *local_90;
  IOMMUTLBEntry iotlb;
  int iommu_idx;
  IOMMUMemoryRegionClass *imrc;
  hwaddr addr;
  MemoryRegion_conflict *mr;
  hwaddr page_mask;
  MemoryRegionSection *section;
  _Bool is_mmio_local;
  _Bool is_write_local;
  hwaddr *page_mask_out_local;
  hwaddr *plen_out_local;
  hwaddr *xlat_local;
  IOMMUMemoryRegion *iommu_mr_local;
  MemTxAttrs attrs_local;
  
  mr = (MemoryRegion_conflict *)0xffffffffffffffff;
  xlat_local = (hwaddr *)iommu_mr;
  while( true ) {
    MVar4 = SUB84(in_stack_ffffffffffffff18,0);
    uVar2 = *xlat;
    pIVar1 = memory_region_get_iommu_class_nocheck((IOMMUMemoryRegion *)xlat_local);
    iotlb._36_4_ = 0;
    if (pIVar1->attrs_to_index != (_func_int_IOMMUMemoryRegion_ptr_MemTxAttrs *)0x0) {
      iotlb._36_4_ = (*pIVar1->attrs_to_index)((IOMMUMemoryRegion *)xlat_local,MVar4);
    }
    IVar3 = IOMMU_RO;
    if (is_write) {
      IVar3 = IOMMU_WO;
    }
    (*pIVar1->translate)(&local_b8,(IOMMUMemoryRegion *)xlat_local,uVar2,IVar3,iotlb._36_4_);
    memcpy(&local_90,&local_b8,0x28);
    if (((uint)iotlb.addr_mask & 1 << is_write) == 0) break;
    uVar2 = iotlb.iova & (iotlb.translated_addr ^ 0xffffffffffffffff) |
            uVar2 & iotlb.translated_addr;
    mr = (MemoryRegion_conflict *)(iotlb.translated_addr & (ulong)mr);
    if (*plen_out < ((uVar2 | iotlb.translated_addr) - uVar2) + 1) {
      in_stack_ffffffffffffff18 = *plen_out;
    }
    else {
      in_stack_ffffffffffffff18 = ((uVar2 | iotlb.translated_addr) - uVar2) + 1;
    }
    *plen_out = in_stack_ffffffffffffff18;
    *target_as = local_90;
    d = address_space_to_dispatch(local_90);
    __src = address_space_translate_internal(d,uVar2,xlat,plen_out,is_mmio);
    xlat_local = (hwaddr *)memory_region_get_iommu((MemoryRegion_conflict *)__src->mr);
    if ((IOMMUMemoryRegion *)xlat_local == (IOMMUMemoryRegion *)0x0) {
      if (page_mask_out != (hwaddr *)0x0) {
        *page_mask_out = (hwaddr)mr;
      }
      memcpy(__return_storage_ptr__,__src,0x40);
      return __return_storage_ptr__;
    }
  }
  memset(__return_storage_ptr__,0,0x40);
  __return_storage_ptr__->mr = &((iommu_mr->parent_obj).uc)->io_mem_unassigned;
  return __return_storage_ptr__;
}

Assistant:

static MemoryRegionSection address_space_translate_iommu(IOMMUMemoryRegion *iommu_mr,
                                                         hwaddr *xlat,
                                                         hwaddr *plen_out,
                                                         hwaddr *page_mask_out,
                                                         bool is_write,
                                                         bool is_mmio,
                                                         AddressSpace **target_as,
                                                         MemTxAttrs attrs)
{
    MemoryRegionSection *section;
    hwaddr page_mask = (hwaddr)-1;
    MemoryRegion *mr = MEMORY_REGION(iommu_mr);

    do {
        hwaddr addr = *xlat;
        IOMMUMemoryRegionClass *imrc = memory_region_get_iommu_class_nocheck(iommu_mr);
        int iommu_idx = 0;
        IOMMUTLBEntry iotlb;

        if (imrc->attrs_to_index) {
            iommu_idx = imrc->attrs_to_index(iommu_mr, attrs);
        }

        iotlb = imrc->translate(iommu_mr, addr, is_write ?
                                IOMMU_WO : IOMMU_RO, iommu_idx);

        if (!(iotlb.perm & (1 << is_write))) {
            goto unassigned;
        }

        addr = ((iotlb.translated_addr & ~iotlb.addr_mask)
                | (addr & iotlb.addr_mask));
        page_mask &= iotlb.addr_mask;
        *plen_out = MIN(*plen_out, (addr | iotlb.addr_mask) - addr + 1);
        *target_as = iotlb.target_as;

        section = address_space_translate_internal(
                address_space_to_dispatch(iotlb.target_as), addr, xlat,
                plen_out, is_mmio);

        iommu_mr = memory_region_get_iommu(section->mr);
    } while (unlikely(iommu_mr));

    if (page_mask_out) {
        *page_mask_out = page_mask;
    }
    return *section;

unassigned:
    return (MemoryRegionSection) { .mr = &(mr->uc->io_mem_unassigned) };
}